

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::detail::ReductionFunctor<Block,_diy::detail::KDTreePartners>::operator()
          (ReductionFunctor<Block,_diy::detail::KDTreePartners> *this,Block *b,ProxyWithLink *cp)

{
  bool bVar1;
  int gid;
  int iVar2;
  size_t sVar3;
  OutgoingQueues *this_00;
  size_type sVar4;
  Link *this_01;
  Proxy *in_RDX;
  KDTreePartners *in_RDI;
  BlockID target;
  const_iterator __end4;
  const_iterator __begin4;
  Neighbors *__range4;
  OutgoingQueues *outgoing;
  ReduceProxy rp;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  KDTreePartners *__args_2;
  ReduceProxy *in_stack_fffffffffffffe40;
  Block *in_stack_fffffffffffffe48;
  function<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>
  *in_stack_fffffffffffffe50;
  Master *in_stack_fffffffffffffe58;
  Master *m;
  int in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe64;
  int iVar5;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  KDTreePartners *in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  GIDVector *in_stack_fffffffffffffe98;
  Assigner *in_stack_fffffffffffffea0;
  __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
  in_stack_fffffffffffffea8;
  uint round;
  void *in_stack_fffffffffffffeb0;
  Proxy *in_stack_fffffffffffffeb8;
  ReduceProxy *in_stack_fffffffffffffec0;
  IExchangeInfo *in_stack_fffffffffffffed0;
  undefined1 local_48 [72];
  
  round = (uint)((ulong)in_stack_fffffffffffffea8._M_current >> 0x20);
  local_48._48_8_ = in_RDX;
  Master::Proxy::gid(in_RDX);
  Master::Proxy::master((Proxy *)local_48._48_8_);
  bVar1 = KDTreePartners::active
                    ((KDTreePartners *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)
                     ,in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58)
  ;
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1aa847);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1aa854);
    if (0 < (in_RDI->decomposer).dim) {
      in_stack_fffffffffffffe70 =
           (KDTreePartners *)
           (in_RDI->decomposer).domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
           m_static_data;
      in_stack_fffffffffffffe78 = (in_RDI->decomposer).dim;
      in_stack_fffffffffffffe7c = Master::Proxy::gid((Proxy *)local_48._48_8_);
      Master::Proxy::master((Proxy *)local_48._48_8_);
      KDTreePartners::incoming
                (in_RDI,in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70,
                 (Master *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    }
    iVar2 = (in_RDI->decomposer).dim;
    sVar3 = KDTreePartners::rounds((KDTreePartners *)0x1aa8e1);
    if (iVar2 < (int)sVar3) {
      m = (Master *)
          (in_RDI->decomposer).domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.
          m_static_data;
      iVar5 = (in_RDI->decomposer).dim;
      gid = Master::Proxy::gid((Proxy *)local_48._48_8_);
      Master::Proxy::master((Proxy *)local_48._48_8_);
      KDTreePartners::outgoing
                (in_stack_fffffffffffffe70,iVar2,gid,
                 (vector<int,_std::allocator<int>_> *)CONCAT44(iVar5,in_stack_fffffffffffffe60),m);
    }
    __args_2 = (KDTreePartners *)local_48;
    ReduceProxy::ReduceProxy
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,round,
               in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
               (GIDVector *)in_stack_fffffffffffffed0);
    std::function<void_(Block_*,_const_diy::ReduceProxy_&,_const_diy::detail::KDTreePartners_&)>::
    operator()(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
               __args_2);
    this_00 = Master::Proxy::outgoing((Proxy *)&stack0xfffffffffffffec0);
    sVar4 = std::
            map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            ::size((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                    *)0x1aa9da);
    ReduceProxy::out_link((ReduceProxy *)&stack0xfffffffffffffec0);
    iVar2 = Link::size((Link *)0x1aa9f4);
    if (sVar4 < (ulong)(long)iVar2) {
      this_01 = ReduceProxy::out_link((ReduceProxy *)&stack0xfffffffffffffec0);
      in_stack_fffffffffffffe40 = (ReduceProxy *)Link::neighbors(this_01);
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::begin
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::end
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)in_stack_fffffffffffffe40,
                                (__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)__args_2), bVar1) {
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator*((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                     *)&stack0xfffffffffffffea8);
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)in_RDI,
                     (key_type *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator++((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                      *)&stack0xfffffffffffffea8);
      }
    }
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffe40);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }